

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_linux.cpp
# Opt level: O1

FUNCTION_RETURN
getDiskInfos_dev(vector<DiskInfo,_std::allocator<DiskInfo>_> *disk_infos,
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *disk_by_uuid)

{
  iterator __position;
  int iVar1;
  DIR *pDVar2;
  dirent *pdVar3;
  int *piVar4;
  ssize_t sVar5;
  long lVar6;
  size_t sVar7;
  long *plVar8;
  long *plVar9;
  uint out_size;
  char *pcVar10;
  pointer paVar11;
  pointer paVar12;
  bool bVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 uVar15;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  string label_dir;
  string cur_dir;
  string base_dir;
  vector<DiskInfo,_std::allocator<DiskInfo>_> *__range5;
  string device_name_s;
  stat sym_stat;
  DiskInfo tmpDiskInfo;
  char device_name [1024];
  uint *local_aa0;
  long *local_a98;
  undefined8 local_a90;
  undefined4 uStack_a88;
  undefined4 uStack_a84;
  int local_a80;
  char *local_a78 [2];
  char local_a68 [16];
  long *local_a58;
  long local_a50;
  long local_a48;
  long lStack_a40;
  pointer local_a38;
  DIR *local_a30;
  uint *local_a28;
  undefined8 local_a20;
  uint local_a18;
  undefined4 uStack_a14;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  vector<DiskInfo,std::allocator<DiskInfo>> *local_a08;
  char *local_a00 [2];
  char local_9f0 [16];
  pointer local_9e0;
  stat local_9d8;
  anon_struct_1296_7_5326303c local_948;
  char local_438 [1032];
  
  local_a30 = (DIR *)disk_by_uuid;
  pDVar2 = opendir("/dev/disk/by-uuid");
  local_a08 = (vector<DiskInfo,std::allocator<DiskInfo>> *)disk_infos;
  if (pDVar2 == (DIR *)0x0) {
    piVar4 = __errno_location();
    strerror(*piVar4);
    _log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
  }
  else {
    local_a58 = &local_a48;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"/dev/disk/by-uuid/","");
    while ((pdVar3 = readdir(pDVar2), pdVar3 != (dirent *)0x0 &&
           ((ulong)(((long)*(pointer *)((long)disk_infos + 8) - *(long *)disk_infos >> 4) *
                   0x2c3f35ba781948b1) < 0x28))) {
      pcVar10 = pdVar3->d_name;
      iVar1 = strcmp(pcVar10,".");
      if ((iVar1 != 0) &&
         ((iVar1 = strcmp(pcVar10,".."), iVar1 != 0 &&
          (iVar1 = strncmp(pcVar10,"usb",3), iVar1 != 0)))) {
        local_a78[0] = local_a68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a78,local_a58,local_a50 + (long)local_a58);
        std::__cxx11::string::append((char *)local_a78);
        iVar1 = stat(local_a78[0],&local_9d8);
        if (iVar1 == 0) {
          local_a38 = (pointer)local_9d8.st_ino;
          local_948.id = (int)local_9d8.st_ino;
          sVar5 = readlink(local_a78[0],local_438,0x3ff);
          if (sVar5 == -1) {
            piVar4 = __errno_location();
            strerror(*piVar4);
            _log((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          }
          else {
            local_438[sVar5] = '\0';
            local_a00[0] = local_9f0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a00,local_438,local_438 + sVar5);
            lVar6 = std::__cxx11::string::find_last_of
                              ((char *)local_a00,0x43c523,0xffffffffffffffff);
            if (lVar6 != -1) {
              std::__cxx11::string::substr((ulong)&local_aa0,(ulong)local_a00);
              std::__cxx11::string::operator=((string *)local_a00,(string *)&local_aa0);
              if (local_aa0 != (uint *)&local_a90) {
                operator_delete(local_aa0);
              }
            }
            license::mstrlcpy(local_948.device,local_a00[0],0x400);
            parseUUID(pcVar10,local_948.disk_sn,out_size);
            local_948.sn_initialized = true;
            local_948.label_initialized = false;
            local_948.preferred = false;
            paVar11 = *(pointer *)disk_infos;
            if (paVar11 == *(pointer *)((long)disk_infos + 8)) {
              bVar13 = false;
            }
            else {
              do {
                paVar12 = paVar11 + 1;
                bVar13 = false;
                if (local_948.id == paVar11->id) {
                  bVar13 = true;
                  break;
                }
                paVar11 = paVar12;
              } while (paVar12 != *(pointer *)((long)disk_infos + 8));
            }
            local_a28 = &local_a18;
            sVar7 = strlen(pcVar10);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a28,pcVar10,pcVar10 + sVar7);
            local_aa0 = (uint *)&local_a90;
            if (local_a28 == &local_a18) {
              uStack_a88 = uStack_a10;
              uStack_a84 = uStack_a0c;
            }
            else {
              local_aa0 = local_a28;
            }
            local_a90 = (long *)CONCAT44(uStack_a14,local_a18);
            local_a98 = (long *)local_a20;
            local_a20 = 0;
            local_a18 = local_a18 & 0xffffff00;
            local_a80 = local_948.id;
            local_a28 = &local_a18;
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string,int>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_a30,&local_aa0);
            uVar14 = extraout_XMM0_Da_01;
            uVar15 = extraout_XMM0_Db_01;
            if (local_aa0 != (uint *)&local_a90) {
              operator_delete(local_aa0);
              uVar14 = extraout_XMM0_Da_02;
              uVar15 = extraout_XMM0_Db_02;
            }
            if (local_a28 != &local_a18) {
              operator_delete(local_a28);
              uVar14 = extraout_XMM0_Da_03;
              uVar15 = extraout_XMM0_Db_03;
            }
            disk_infos = (vector<DiskInfo,_std::allocator<DiskInfo>_> *)local_a08;
            if (!bVar13) {
              _log((double)CONCAT44(uVar15,uVar14));
              __position._M_current = *(anon_struct_1296_7_5326303c **)((long)disk_infos + 8);
              if (__position._M_current ==
                  *(anon_struct_1296_7_5326303c **)((long)disk_infos + 0x10)) {
                std::vector<DiskInfo,std::allocator<DiskInfo>>::_M_realloc_insert<DiskInfo_const&>
                          ((vector<DiskInfo,std::allocator<DiskInfo>> *)disk_infos,__position,
                           &local_948);
              }
              else {
                memcpy(__position._M_current,&local_948,0x510);
                *(long *)((long)disk_infos + 8) = *(long *)((long)disk_infos + 8) + 0x510;
              }
            }
            if (local_a00[0] != local_9f0) {
              operator_delete(local_a00[0]);
            }
          }
        }
        else {
          piVar4 = __errno_location();
          strerror(*piVar4);
          _log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        }
        if (local_a78[0] != local_a68) {
          operator_delete(local_a78[0]);
        }
      }
    }
    closedir(pDVar2);
    if (local_a58 != &local_a48) {
      operator_delete(local_a58);
    }
  }
  paVar11 = *(pointer *)disk_infos;
  paVar12 = *(pointer *)((long)disk_infos + 8);
  local_aa0 = (uint *)&local_a90;
  local_a58 = (long *)0x12;
  local_aa0 = (uint *)std::__cxx11::string::_M_create((ulong *)&local_aa0,(ulong)&local_a58);
  local_a90 = local_a58;
  *(undefined8 *)local_aa0 = 0x7369642f7665642f;
  *(undefined8 *)(local_aa0 + 2) = 0x62616c2d79622f6b;
  *(undefined2 *)(local_aa0 + 4) = 0x6c65;
  local_a98 = local_a58;
  *(char *)((long)local_aa0 + (long)local_a58) = '\0';
  pDVar2 = opendir((char *)local_aa0);
  if (pDVar2 == (DIR *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_aa0,0,(char *)local_a98,0x43cb75);
    pDVar2 = opendir((char *)local_aa0);
  }
  if (pDVar2 == (DIR *)0x0) {
    piVar4 = __errno_location();
    strerror(*piVar4);
    _log((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
  }
  else {
    local_a38 = paVar11;
    local_a30 = pDVar2;
    local_9e0 = paVar12;
    while( true ) {
      pdVar3 = readdir(pDVar2);
      if (pdVar3 == (dirent *)0x0) break;
      pcVar10 = pdVar3->d_name;
      iVar1 = strcmp(pcVar10,".");
      if ((iVar1 != 0) && (iVar1 = strcmp(pcVar10,".."), iVar1 != 0)) {
        local_a78[0] = local_a68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a78,local_aa0,(char *)((long)local_a98 + (long)local_aa0));
        std::__cxx11::string::append((char *)local_a78);
        plVar8 = (long *)std::__cxx11::string::append((char *)local_a78);
        plVar9 = plVar8 + 2;
        if ((long *)*plVar8 == plVar9) {
          local_a48 = *plVar9;
          lStack_a40 = plVar8[3];
          local_a58 = &local_a48;
        }
        else {
          local_a48 = *plVar9;
          local_a58 = (long *)*plVar8;
        }
        local_a50 = plVar8[1];
        *plVar8 = (long)plVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if (local_a78[0] != local_a68) {
          operator_delete(local_a78[0]);
        }
        iVar1 = stat((char *)local_a58,(stat *)&local_948);
        if (iVar1 == 0) {
          for (paVar11 = *(pointer *)local_a08; paVar11 != *(pointer *)(local_a08 + 8);
              paVar11 = paVar11 + 1) {
            if (paVar11->id == local_948.device._4_4_) {
              license::mstrlcpy(paVar11->label,pcVar10,0xff);
              paVar11->label_initialized = true;
              _log((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
              break;
            }
          }
        }
        else {
          piVar4 = __errno_location();
          strerror(*piVar4);
          _log((double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
        }
        pDVar2 = local_a30;
        if (local_a58 != &local_a48) {
          operator_delete(local_a58);
          pDVar2 = local_a30;
        }
      }
    }
    closedir(pDVar2);
    paVar11 = local_a38;
    paVar12 = local_9e0;
  }
  if (local_aa0 != (uint *)&local_a90) {
    operator_delete(local_aa0);
  }
  return (FUNCTION_RETURN)(paVar12 == paVar11);
}

Assistant:

FUNCTION_RETURN getDiskInfos_dev(std::vector<DiskInfo> &disk_infos,
								 std::unordered_map<std::string, int> &disk_by_uuid) {
	struct dirent *dir = NULL;
	struct stat sym_stat;
	FUNCTION_RETURN result;
	char device_name[MAX_PATH];

	DIR *disk_by_uuid_dir = opendir(ID_FOLDER);
	if (disk_by_uuid_dir == nullptr) {
		LOG_DEBUG("Open " ID_FOLDER " fail: %s", std::strerror(errno));
	} else {
		const std::string base_dir(ID_FOLDER "/");
		while ((dir = readdir(disk_by_uuid_dir)) != nullptr && disk_infos.size() < MAX_UNITS) {
			if (::strcmp(dir->d_name, ".") == 0 || ::strcmp(dir->d_name, "..") == 0 ||
				::strncmp(dir->d_name, "usb", 3) == 0) {
				continue;
			}

			std::string cur_dir = base_dir + dir->d_name;
			if (stat(cur_dir.c_str(), &sym_stat) == 0) {
				DiskInfo tmpDiskInfo;
				tmpDiskInfo.id = sym_stat.st_ino;
				ssize_t len = ::readlink(cur_dir.c_str(), device_name, MAX_PATH - 1);
				if (len != -1) {
					device_name[len] = '\0';
					std::string device_name_s(device_name, len);
					auto pos = device_name_s.find_last_of("/");
					if (pos != std::string::npos) {
						device_name_s = device_name_s.substr(pos + 1);
					}
					mstrlcpy(tmpDiskInfo.device, device_name_s.c_str(), sizeof(tmpDiskInfo.device));
					PARSE_ID_FUNC(dir->d_name, tmpDiskInfo.disk_sn, sizeof(tmpDiskInfo.disk_sn));
					tmpDiskInfo.sn_initialized = true;
					tmpDiskInfo.label_initialized = false;
					tmpDiskInfo.preferred = false;
					bool found = false;
					for (auto diskInfo : disk_infos) {
						if (tmpDiskInfo.id == diskInfo.id) {
							found = true;
							break;
						}
					}
					disk_by_uuid.insert(std::pair<std::string, int>(std::string(dir->d_name), tmpDiskInfo.id));
					if (!found) {
						LOG_DEBUG("Found disk inode %d device %s, sn %s", sym_stat.st_ino, tmpDiskInfo.device,
								  dir->d_name);
						disk_infos.push_back(tmpDiskInfo);
					}
				} else {
					LOG_DEBUG("Error %s during readlink of %s", std::strerror(errno), cur_dir.c_str());
				}
			} else {
				LOG_DEBUG("Error %s during stat of %s", std::strerror(errno), cur_dir.c_str());
			}
		}
		closedir(disk_by_uuid_dir);
	}

	result = disk_infos.size() > 0 ? FUNCTION_RETURN::FUNC_RET_OK : FUNCTION_RETURN::FUNC_RET_NOT_AVAIL;
	read_disk_labels(disk_infos);
	return result;
}